

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O2

void __thiscall FreeOpInfoProtos::~FreeOpInfoProtos(FreeOpInfoProtos *this)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x3e0; lVar1 = lVar1 + 0x10) {
    ZCC_OpInfoType::FreeAllProtos((ZCC_OpInfoType *)((long)&ZCC_OpInfo[0].OpName + lVar1));
  }
  return;
}

Assistant:

~FreeOpInfoProtos()
	{
		for (size_t i = 0; i < countof(ZCC_OpInfo); ++i)
		{
			ZCC_OpInfo[i].FreeAllProtos();
		}
	}